

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool __thiscall
pugi::impl::anon_unknown_0::document_order_comparator::operator()
          (document_order_comparator *this,xpath_node *lhs,xpath_node *rhs)

{
  xml_attribute_struct *pxVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  void *pvVar4;
  void *pvVar5;
  xml_node_struct *pxVar6;
  xml_node_struct *pxVar7;
  xml_attribute_struct *pxVar8;
  xml_node_struct *pxVar9;
  xml_node_struct *pxVar10;
  bool bVar11;
  
  pvVar4 = document_buffer_order((xpath_node *)this);
  pvVar5 = document_buffer_order(lhs);
  if (pvVar5 != (void *)0x0 && pvVar4 != (void *)0x0) {
    return pvVar4 < pvVar5;
  }
  pxVar8 = *(xml_attribute_struct **)(this + 8);
  pxVar1 = (lhs->_attribute)._attr;
  pxVar7 = (xml_node_struct *)0x0;
  if (pxVar1 == (xml_attribute_struct *)0x0) {
    pxVar7 = (lhs->_node)._root;
  }
  pxVar6 = *(xml_node_struct **)this;
  if (pxVar8 == (xml_attribute_struct *)0x0) {
LAB_0012d87b:
    if (pxVar1 == (xml_attribute_struct *)0x0) goto LAB_0012d88c;
    if ((lhs->_node)._root == *(xml_node_struct **)this) {
      return true;
    }
  }
  else {
    if (pxVar1 == (xml_attribute_struct *)0x0) {
      pxVar6 = (xml_node_struct *)0x0;
      if (pxVar8 != (xml_attribute_struct *)0x0) {
        if (*(xml_node_struct **)this == pxVar7) {
          return false;
        }
        pxVar6 = *(xml_node_struct **)this;
        goto LAB_0012d88c;
      }
      goto LAB_0012d87b;
    }
    if (*(xml_node_struct **)this == (lhs->_node)._root) {
      if (pxVar8 == pxVar1) {
        return true;
      }
      do {
        pxVar8 = pxVar8->next_attribute;
        if (pxVar8 == (xml_attribute_struct *)0x0) break;
      } while (pxVar8 != pxVar1);
      return pxVar8 != (xml_attribute_struct *)0x0;
    }
    pxVar6 = *(xml_node_struct **)this;
  }
  pxVar7 = (lhs->_node)._root;
LAB_0012d88c:
  if (pxVar6 == pxVar7) {
    return false;
  }
  if ((pxVar7 == (xml_node_struct *)0x0) ||
     (pxVar2 = pxVar6, pxVar3 = pxVar7, pxVar6 == (xml_node_struct *)0x0)) {
    return pxVar6 < pxVar7;
  }
  while ((pxVar9 = pxVar3, pxVar10 = pxVar2, pxVar10 != (xml_node_struct *)0x0 &&
         (pxVar9 != (xml_node_struct *)0x0))) {
    pxVar2 = pxVar10->parent;
    pxVar3 = pxVar9->parent;
    if (pxVar2 == pxVar9->parent) {
      pxVar7 = pxVar9;
      pxVar6 = pxVar10;
      if (pxVar2 != (xml_node_struct *)0x0) {
        while( true ) {
          bVar11 = pxVar6 == pxVar9;
          if (bVar11) {
            return bVar11;
          }
          if (pxVar7 == pxVar10) break;
          pxVar7 = pxVar7->next_sibling;
          if ((pxVar6->next_sibling == (xml_node_struct *)0x0) ||
             (pxVar6 = pxVar6->next_sibling, pxVar7 == (xml_node_struct *)0x0)) {
            return pxVar7 == (xml_node_struct *)0x0;
          }
        }
        return bVar11;
      }
LAB_0012d9ca:
      return pxVar10 < pxVar9;
    }
  }
  bVar11 = pxVar10 == (xml_node_struct *)0x0;
  if (!bVar11) {
    do {
      pxVar10 = pxVar10->parent;
      pxVar6 = pxVar6->parent;
    } while (pxVar10 != (xml_node_struct *)0x0);
  }
  for (; pxVar9 != (xml_node_struct *)0x0; pxVar9 = pxVar9->parent) {
    pxVar7 = pxVar7->parent;
  }
  if (pxVar6 == pxVar7) {
    return bVar11;
  }
  do {
    pxVar9 = pxVar7;
    pxVar10 = pxVar6;
    pxVar6 = pxVar10->parent;
    pxVar7 = pxVar9->parent;
  } while (pxVar6 != pxVar9->parent);
  pxVar7 = pxVar10;
  pxVar2 = pxVar9;
  if (pxVar6 != (xml_node_struct *)0x0) {
    while( true ) {
      if (pxVar7 == (xml_node_struct *)0x0) {
        return pxVar2 == (xml_node_struct *)0x0;
      }
      if (pxVar2 == (xml_node_struct *)0x0) {
        return pxVar2 == (xml_node_struct *)0x0;
      }
      bVar11 = pxVar7 == pxVar9;
      if (bVar11) {
        return bVar11;
      }
      if (pxVar2 == pxVar10) break;
      pxVar7 = pxVar7->next_sibling;
      pxVar2 = pxVar2->next_sibling;
    }
    return bVar11;
  }
  goto LAB_0012d9ca;
}

Assistant:

bool operator()(const xpath_node& lhs, const xpath_node& rhs) const
		{
			// optimized document order based check
			const void* lo = document_buffer_order(lhs);
			const void* ro = document_buffer_order(rhs);

			if (lo && ro) return lo < ro;

			// slow comparison
			xml_node ln = lhs.node(), rn = rhs.node();

			// compare attributes
			if (lhs.attribute() && rhs.attribute())
			{
				// shared parent
				if (lhs.parent() == rhs.parent())
				{
					// determine sibling order
					for (xml_attribute a = lhs.attribute(); a; a = a.next_attribute())
						if (a == rhs.attribute())
							return true;

					return false;
				}

				// compare attribute parents
				ln = lhs.parent();
				rn = rhs.parent();
			}
			else if (lhs.attribute())
			{
				// attributes go after the parent element
				if (lhs.parent() == rhs.node()) return false;

				ln = lhs.parent();
			}
			else if (rhs.attribute())
			{
				// attributes go after the parent element
				if (rhs.parent() == lhs.node()) return true;

				rn = rhs.parent();
			}

			if (ln == rn) return false;

			if (!ln || !rn) return ln < rn;

			return node_is_before(ln.internal_object(), rn.internal_object());
		}